

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

xmlChar * xmlTextReaderReadOuterXml(xmlTextReaderPtr reader)

{
  xmlDocPtr doc;
  xmlChar *pxVar1;
  int iVar2;
  xmlNodePtr pxVar3;
  xmlDtdPtr pxVar4;
  xmlBufferPtr buf;
  
  pxVar3 = xmlTextReaderExpand(reader);
  if (pxVar3 != (xmlNodePtr)0x0) {
    pxVar4 = (xmlDtdPtr)reader->node;
    doc = pxVar4->doc;
    if (pxVar4->type == XML_DTD_NODE) {
      pxVar4 = xmlCopyDtd(pxVar4);
    }
    else {
      pxVar4 = (xmlDtdPtr)xmlDocCopyNode((xmlNodePtr)pxVar4,doc,1);
    }
    buf = xmlBufferCreate();
    xmlBufferSetAllocationScheme(buf,XML_BUFFER_ALLOC_DOUBLEIT);
    iVar2 = xmlNodeDump(buf,doc,(xmlNodePtr)pxVar4,0,0);
    if (iVar2 != -1) {
      pxVar1 = buf->content;
      buf->content = (xmlChar *)0x0;
      xmlFreeNode((xmlNodePtr)pxVar4);
      xmlBufferFree(buf);
      return pxVar1;
    }
    xmlFreeNode((xmlNodePtr)pxVar4);
    xmlBufferFree(buf);
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlTextReaderReadOuterXml(xmlTextReaderPtr reader ATTRIBUTE_UNUSED)
{
    xmlChar *resbuf;
    xmlNodePtr node;
    xmlBufferPtr buff;
    xmlDocPtr doc;

    if (xmlTextReaderExpand(reader) == NULL) {
        return NULL;
    }
    node = reader->node;
    doc = node->doc;
    /* XXX: Why is the node copied? */
	if (node->type == XML_DTD_NODE) {
		node = (xmlNodePtr) xmlCopyDtd((xmlDtdPtr) node);
	} else {
		node = xmlDocCopyNode(node, doc, 1);
	}
    buff = xmlBufferCreate();
    xmlBufferSetAllocationScheme(buff, XML_BUFFER_ALLOC_DOUBLEIT);
    if (xmlNodeDump(buff, doc, node, 0, 0) == -1) {
        xmlFreeNode(node);
        xmlBufferFree(buff);
        return NULL;
    }

    resbuf = buff->content;
    buff->content = NULL;

    xmlFreeNode(node);
    xmlBufferFree(buff);
    return resbuf;
}